

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaParserCtxtPtr xmlSchemaNewDocParserCtxt(xmlDocPtr doc)

{
  xmlSchemaParserCtxtPtr pxVar1;
  xmlDictPtr pxVar2;
  
  if ((doc != (xmlDocPtr)0x0) &&
     (pxVar1 = xmlSchemaParserCtxtCreate(), pxVar1 != (xmlSchemaParserCtxtPtr)0x0)) {
    pxVar1->doc = doc;
    pxVar2 = xmlDictCreate();
    pxVar1->dict = pxVar2;
    pxVar1->preserve = 1;
    return pxVar1;
  }
  return (xmlSchemaParserCtxtPtr)0x0;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewDocParserCtxt(xmlDocPtr doc)
{
    xmlSchemaParserCtxtPtr ret;

    if (doc == NULL)
      return (NULL);
    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->doc = doc;
    ret->dict = xmlDictCreate();
    /* The application has responsibility for the document */
    ret->preserve = 1;

    return (ret);
}